

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.c
# Opt level: O2

Bool prvTidyParseConfigValue(TidyDocImpl *doc,TidyOptionId optId,ctmbstr optval)

{
  ParseProperty *pPVar1;
  uint uVar2;
  tchar tVar3;
  Bool BVar4;
  StreamIn *pSVar5;
  TidyBuffer inbuf;
  
  if (optId < N_TIDY_OPTIONS) {
    pPVar1 = option_defs[optId].parser;
    if (optval == (ctmbstr)0x0 || pPVar1 == (ParseProperty *)0x0) {
      prvTidyReportBadArgument(doc,option_defs[optId].name);
      BVar4 = no;
    }
    else {
      tidyBufInitWithAllocator(&inbuf,doc->allocator);
      uVar2 = prvTidytmbstrlen(optval);
      tidyBufAttach(&inbuf,(byte *)optval,uVar2 + 1);
      pSVar5 = prvTidyBufferInput(doc,&inbuf,0);
      (doc->config).cfgIn = pSVar5;
      tVar3 = GetC(&doc->config);
      (doc->config).c = tVar3;
      BVar4 = (*pPVar1)(doc,option_defs + optId);
      prvTidyfreeStreamIn((doc->config).cfgIn);
      (doc->config).cfgIn = (StreamIn *)0x0;
      tidyBufDetach(&inbuf);
    }
  }
  else {
    BVar4 = no;
    prvTidytmbsnprintf((tmbstr)&inbuf,0xb,"%u");
    prvTidyReportUnknownOption(doc,(ctmbstr)&inbuf);
  }
  return BVar4;
}

Assistant:

Bool TY_(ParseConfigValue)( TidyDocImpl* doc, TidyOptionId optId, ctmbstr optval )
{
    const TidyOptionImpl* option = NULL;
    /* #472: fail status if there is a NULL parser. @ralfjunker */
    Bool status = ( optId < N_TIDY_OPTIONS
                   && (option = option_defs + optId)->parser
                   && optval != NULL );

    if ( !status )
        if ( option )
            TY_(ReportBadArgument)(doc, option->name);
        else
        {
            /* If optId < N_TIDY_OPTIONS then option remains unassigned,
               and we have to fall back to an ugly error message. */
            enum { sizeBuf = 11 }; /* uint_max is 10 characters */
            char buffer[sizeBuf];
            TY_(tmbsnprintf(buffer, sizeBuf, "%u", optId));
            TY_(ReportUnknownOption(doc, buffer));
        }
    else
    {
        TidyBuffer inbuf;            /* Set up input source */
        tidyBufInitWithAllocator( &inbuf, doc->allocator );
        tidyBufAttach( &inbuf, (byte*)optval, TY_(tmbstrlen)(optval)+1 );
        if (optId == TidyOutFile)
            doc->config.cfgIn = TY_(BufferInput)( doc, &inbuf, RAW );
        else
            doc->config.cfgIn = TY_(BufferInput)( doc, &inbuf, RAW ); /* Issue #468 - Was ASCII! */
        doc->config.c = GetC( &doc->config );

        status = option->parser( doc, option );

        TY_(freeStreamIn)(doc->config.cfgIn);  /* Release input source */
        doc->config.cfgIn  = NULL;
        tidyBufDetach( &inbuf );
    }
    return status;
}